

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_tec(REF_FACELIFT ref_facelift,char *filename)

{
  REF_GEOM pRVar1;
  uint uVar2;
  FILE *__stream;
  REF_INT local_58;
  REF_INT local_54;
  REF_INT local_50;
  REF_INT local_4c;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT id;
  REF_INT geom;
  FILE *file;
  REF_GEOM ref_geom;
  char *filename_local;
  REF_FACELIFT ref_facelift_local;
  
  pRVar1 = ref_facelift->grid->geom;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x4f5,"ref_facelift_tec","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    __stream = fopen(filename,"w");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x4f9,"ref_facelift_tec","unable to open file");
      ref_facelift_local._4_4_ = 2;
    }
    else {
      fprintf(__stream,"title=\"refine watertight cad displacement\"\n");
      fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"d\" \"u\" \"v\" \"dx\" \"dy\" \"dz\"\n");
      ref_private_macro_code_rss = 0x7fffffff;
      ref_private_macro_code_rss_1 = -0x80000000;
      for (min_id = 0; min_id < pRVar1->max; min_id = min_id + 1) {
        if (pRVar1->descr[min_id * 6] == 1) {
          if (ref_private_macro_code_rss < pRVar1->descr[min_id * 6 + 1]) {
            local_4c = ref_private_macro_code_rss;
          }
          else {
            local_4c = pRVar1->descr[min_id * 6 + 1];
          }
          ref_private_macro_code_rss = local_4c;
          if (pRVar1->descr[min_id * 6 + 1] < ref_private_macro_code_rss_1) {
            local_50 = ref_private_macro_code_rss_1;
          }
          else {
            local_50 = pRVar1->descr[min_id * 6 + 1];
          }
          ref_private_macro_code_rss_1 = local_50;
        }
      }
      for (max_id = ref_private_macro_code_rss; max_id <= ref_private_macro_code_rss_1;
          max_id = max_id + 1) {
        uVar2 = ref_facelift_edge_tec_zone(ref_facelift,max_id,(FILE *)__stream);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x508,"ref_facelift_tec",(ulong)uVar2,"tec edge");
          return uVar2;
        }
      }
      ref_private_macro_code_rss = 0x7fffffff;
      ref_private_macro_code_rss_1 = -0x80000000;
      for (min_id = 0; min_id < pRVar1->max; min_id = min_id + 1) {
        if (pRVar1->descr[min_id * 6] == 2) {
          if (ref_private_macro_code_rss < pRVar1->descr[min_id * 6 + 1]) {
            local_54 = ref_private_macro_code_rss;
          }
          else {
            local_54 = pRVar1->descr[min_id * 6 + 1];
          }
          ref_private_macro_code_rss = local_54;
          if (pRVar1->descr[min_id * 6 + 1] < ref_private_macro_code_rss_1) {
            local_58 = ref_private_macro_code_rss_1;
          }
          else {
            local_58 = pRVar1->descr[min_id * 6 + 1];
          }
          ref_private_macro_code_rss_1 = local_58;
        }
      }
      for (max_id = ref_private_macro_code_rss; max_id <= ref_private_macro_code_rss_1;
          max_id = max_id + 1) {
        uVar2 = ref_facelift_face_tec_zone(ref_facelift,max_id,(FILE *)__stream);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x512,"ref_facelift_tec",(ulong)uVar2,"tec face");
          return uVar2;
        }
      }
      fclose(__stream);
      ref_facelift_local._4_4_ = 0;
    }
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_tec(REF_FACELIFT ref_facelift,
                                    const char *filename) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  FILE *file;
  REF_INT geom, id, min_id, max_id;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine watertight cad displacement\"\n");
  fprintf(
      file,
      "variables = \"x\" \"y\" \"z\" \"d\" \"u\" \"v\" \"dx\" \"dy\" \"dz\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_edge(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_facelift_edge_tec_zone(ref_facelift, id, file), "tec edge");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_facelift_face_tec_zone(ref_facelift, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}